

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChLoadsXYZnode.cpp
# Opt level: O2

void __thiscall
chrono::ChLoadXYZnodeBodyBushing::ChLoadXYZnodeBodyBushing
          (ChLoadXYZnodeBodyBushing *this,shared_ptr<chrono::ChNodeXYZ> *mnodeA,
          shared_ptr<chrono::ChBody> *mbodyB)

{
  double dVar1;
  __shared_ptr<chrono::ChFunction_Const,_(__gnu_cxx::_Lock_policy)2> _Stack_58;
  undefined8 local_48;
  __shared_ptr<chrono::ChBody,_(__gnu_cxx::_Lock_policy)2> local_40;
  __shared_ptr<chrono::ChNodeXYZ,_(__gnu_cxx::_Lock_policy)2> local_30;
  
  std::__shared_ptr<chrono::ChNodeXYZ,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            (&local_30,&mnodeA->super___shared_ptr<chrono::ChNodeXYZ,_(__gnu_cxx::_Lock_policy)2>);
  std::__shared_ptr<chrono::ChBody,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            (&local_40,&mbodyB->super___shared_ptr<chrono::ChBody,_(__gnu_cxx::_Lock_policy)2>);
  ChLoadXYZnodeBody::ChLoadXYZnodeBody
            (&this->super_ChLoadXYZnodeBody,(shared_ptr<chrono::ChNodeXYZ> *)&local_30,
             (shared_ptr<chrono::ChBody> *)&local_40);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_40._M_refcount);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_30._M_refcount);
  (this->super_ChLoadXYZnodeBody).super_ChLoadCustomMultiple.super_ChLoadBase.super_ChObj.
  _vptr_ChObj = (_func_int **)&PTR__ChLoadXYZnodeBodyBushing_0116d8b0;
  (this->force_dX).super___shared_ptr<chrono::ChFunction,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  (this->force_dX).super___shared_ptr<chrono::ChFunction,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  (this->force_dY).super___shared_ptr<chrono::ChFunction,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  (this->force_dY).super___shared_ptr<chrono::ChFunction,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  (this->force_dZ).super___shared_ptr<chrono::ChFunction,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  (this->force_dZ).super___shared_ptr<chrono::ChFunction,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  (this->R).m_data[0] = 0.0;
  (this->R).m_data[1] = 0.0;
  (this->R).m_data[2] = 0.0;
  local_48 = 0;
  std::make_shared<chrono::ChFunction_Const,double>((double *)&_Stack_58);
  std::__shared_ptr<chrono::ChFunction,(__gnu_cxx::_Lock_policy)2>::operator=
            ((__shared_ptr<chrono::ChFunction,(__gnu_cxx::_Lock_policy)2> *)&this->force_dX,
             &_Stack_58);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&_Stack_58._M_refcount);
  local_48 = 0;
  std::make_shared<chrono::ChFunction_Const,double>((double *)&_Stack_58);
  std::__shared_ptr<chrono::ChFunction,(__gnu_cxx::_Lock_policy)2>::operator=
            ((__shared_ptr<chrono::ChFunction,(__gnu_cxx::_Lock_policy)2> *)&this->force_dY,
             &_Stack_58);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&_Stack_58._M_refcount);
  local_48 = 0;
  std::make_shared<chrono::ChFunction_Const,double>((double *)&_Stack_58);
  std::__shared_ptr<chrono::ChFunction,(__gnu_cxx::_Lock_policy)2>::operator=
            ((__shared_ptr<chrono::ChFunction,(__gnu_cxx::_Lock_policy)2> *)&this->force_dZ,
             &_Stack_58);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&_Stack_58._M_refcount);
  dVar1 = DAT_011dd3e0;
  if (this != (ChLoadXYZnodeBodyBushing *)(sBulletDNAstr64 + 0x3510)) {
    (this->R).m_data[0] = VNULL;
    (this->R).m_data[1] = dVar1;
    (this->R).m_data[2] = DAT_011dd3e8;
  }
  this->is_stiff = false;
  return;
}

Assistant:

ChLoadXYZnodeBodyBushing::ChLoadXYZnodeBodyBushing(std::shared_ptr<ChNodeXYZ> mnodeA,  ///< node to apply load to
								  std::shared_ptr<ChBody> mbodyB   ///< node to apply load to as reaction
								  )	
    : ChLoadXYZnodeBody(mnodeA, mbodyB)
     {
	force_dX = chrono_types::make_shared<ChFunction_Const>(0.0);
	force_dY = chrono_types::make_shared<ChFunction_Const>(0.0);
	force_dZ = chrono_types::make_shared<ChFunction_Const>(0.0);
	R = VNULL;
	is_stiff = false;
}